

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

uint Assimp::strtoul8(char *in,char **out)

{
  undefined4 local_1c;
  uint value;
  char **out_local;
  char *in_local;
  
  local_1c = 0;
  for (out_local = (char **)in; ('/' < *(char *)out_local && (*(char *)out_local < '8'));
      out_local = (char **)((long)out_local + 1)) {
    local_1c = local_1c * 8 + *(char *)out_local + -0x30;
  }
  if (out != (char **)0x0) {
    *out = (char *)out_local;
  }
  return local_1c;
}

Assistant:

inline
unsigned int strtoul8( const char* in, const char** out=0) {
    unsigned int value( 0 );
    for ( ;; ) {
        if ( *in < '0' || *in > '7' ) {
            break;
        }

        value = ( value << 3 ) + ( *in - '0' );
        ++in;
    }
    if ( out ) {
        *out = in;
    }
    return value;
}